

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_KillTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  int selector_00;
  int flags;
  char *pcVar5;
  int iVar6;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003edfde;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003edfaf:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003edfde:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1796,
                  "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003eddf9;
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003edfde;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003edfaf;
LAB_003eddf9:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee06c:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1797,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[1].field_0.i;
LAB_003ede4e:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee08b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1798,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[2].field_0.i;
LAB_003ede5d:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003edfb8:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003edfbf:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1799,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003edfb8;
      local_40 = (PClassActor *)0x0;
    }
LAB_003ede7f:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee03b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x179a,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[4].field_0.i;
LAB_003ede8e:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee01c:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x179b,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee06c;
    }
    iVar4 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003ede4e;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee08b;
    }
    flags = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ede5d;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[3].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003edfbf;
    }
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ede7f;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee03b;
    }
    iVar6 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ede8e;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee01c;
    }
    selector_00 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003edffd;
      }
      goto LAB_003edeb0;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003edffd:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x179c,
                  "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003edeb0:
  selector = param[6].field_0.i;
  source = COPY_AAPTR(pAVar3,selector_00);
  inflictor = COPY_AAPTR(pAVar3,selector);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->target);
  if (pAVar2 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->target);
    local_38.Index = iVar6;
    local_34.Index = iVar4;
    DoKill(pAVar3,inflictor,source,&local_34,flags,local_40,&local_38);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->target != NULL)
		DoKill(self->target, inflictor, source, damagetype, flags, filter, species);
	return 0;
}